

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenio::save_faces2smesh(tetgenio *this,char *filebasename)

{
  FILE *__stream;
  int iVar1;
  int local_42c;
  int j;
  int i;
  char outsmeshfilename [1024];
  FILE *fout;
  char *filebasename_local;
  tetgenio *this_local;
  
  sprintf((char *)&j,"%s.smesh",filebasename);
  printf("Saving faces to %s\n",&j);
  __stream = fopen((char *)&j,"w");
  fprintf(__stream,"%d  %d  %d  %d\n",0,(ulong)(uint)this->mesh_dim,
          (ulong)(uint)this->numberofpointattributes,(ulong)(this->pointmarkerlist != (int *)0x0));
  fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberoftrifaces,
          (ulong)(this->trifacemarkerlist != (int *)0x0));
  for (local_42c = 0; local_42c < this->numberoftrifaces; local_42c = local_42c + 1) {
    iVar1 = local_42c * 3;
    fprintf(__stream,"3  %d %d %d",(ulong)(uint)this->trifacelist[iVar1],
            (ulong)(uint)this->trifacelist[iVar1 + 1],(ulong)(uint)this->trifacelist[iVar1 + 2]);
    if (this->trifacemarkerlist != (int *)0x0) {
      fprintf(__stream,"  %d",(ulong)(uint)this->trifacemarkerlist[local_42c]);
    }
    fprintf(__stream,"\n");
  }
  fprintf(__stream,"0\n");
  fprintf(__stream,"0\n");
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_faces2smesh(char* filebasename)
{
  FILE *fout;
  char outsmeshfilename[FILENAMESIZE];
  int i, j;

  sprintf(outsmeshfilename, "%s.smesh", filebasename);
  printf("Saving faces to %s\n", outsmeshfilename);
  fout = fopen(outsmeshfilename, "w");

  // The zero indicates that the vertices are in a separate .node file.
  //   Followed by number of dimensions, number of vertex attributes,
  //   and number of boundary markers (zero or one).
  fprintf(fout, "%d  %d  %d  %d\n", 0, mesh_dim, numberofpointattributes,
          pointmarkerlist != NULL ? 1 : 0);

  // Number of facets, number of boundary markers (zero or one).
  fprintf(fout, "%d  %d\n", numberoftrifaces, 
          trifacemarkerlist != NULL ? 1 : 0);

  // Output triangular facets.
  for (i = 0; i < numberoftrifaces; i++) {
    j = i * 3;
    fprintf(fout, "3  %d %d %d", trifacelist[j], trifacelist[j + 1], 
            trifacelist[j + 2]);
    if (trifacemarkerlist != NULL) {
      fprintf(fout, "  %d", trifacemarkerlist[i]);
    }
    fprintf(fout, "\n");
  }

  // No holes and regions.
  fprintf(fout, "0\n");
  fprintf(fout, "0\n");

  fclose(fout);  
}